

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportBuildFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *param_3)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_00;
  iterator __first;
  iterator __last;
  string *this_00;
  cmMakefile *this_01;
  ostream *poVar4;
  string *psVar5;
  size_type sVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  undefined1 auVar8 [16];
  string_view str;
  bool local_4a9;
  bool local_491;
  string_view local_460;
  string_view local_450;
  char local_439;
  cmAlphaNum local_438;
  cmAlphaNum local_408;
  string local_3d8;
  cmAlphaNum local_3b8;
  cmAlphaNum local_388;
  string local_358;
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  string dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *directory;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_2e0;
  undefined1 local_2c0 [8];
  ostringstream e;
  cmMakefile *mf;
  string *type;
  undefined1 local_c0 [7];
  bool contextSensitive;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  cmTargetExport *param_3_local;
  cmFileSet *fileSet_local;
  cmGeneratorTarget *gte_local;
  cmExportBuildFileGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&configs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileDirectoryEntries
            ((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              *)&__range1,fileSet);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar2) break;
    config_00 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    directories.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = config_00;
    cmFileSet::EvaluateDirectoryEntries
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0,fileSet,
               (vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                *)&__range1,gte->LocalGenerator,config_00,gte,(cmGeneratorExpressionDAGChecker *)0x0
              );
    __first = std::
              vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
              ::begin((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       *)&__range1);
    __last = std::
             vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ::end((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    *)&__range1);
    bVar2 = std::
            any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>*,std::vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>>,bool(*)(std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>const&)>
                      ((__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )__first._M_current,
                       (__normal_iterator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_*,_std::vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>_>
                        )__last._M_current,anon_unknown.dwarf_c309a9::EntryIsContextSensitive);
    this_00 = cmFileSet::GetType_abi_cxx11_(fileSet);
    local_491 = false;
    if (bVar2) {
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      bVar7 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("CXX_MODULES",0xb);
      bVar3 = std::operator==(_Var1,bVar7);
      local_4a9 = true;
      if (!bVar3) {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        bVar7 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("CXX_MODULE_HEADER_UNITS",0x17);
        local_4a9 = std::operator==(_Var1,bVar7);
      }
      local_491 = local_4a9;
    }
    if (local_491 == false) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_c0);
      directory = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c0);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&directory);
        if (!bVar3) break;
        dest.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)dest.field_2._8_8_);
        str._M_len = auVar8._8_8_;
        str._M_str = (char *)0x1;
        local_338 = auVar8;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  ((string *)local_328,auVar8._0_8_,str,(WrapQuotes)config_00);
        if (bVar2) {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_60);
          if (sVar6 == 1) goto LAB_0061ad40;
          cmAlphaNum::cmAlphaNum(&local_388,"\"$<$<CONFIG:");
          cmAlphaNum::cmAlphaNum
                    (&local_3b8,
                     directories.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          config_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328
          ;
          cmStrCat<char[3],std::__cxx11::string,char[3]>
                    (&local_358,&local_388,&local_3b8,(char (*) [3])">:",config_00,
                     (char (*) [3])">\"");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&configs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_358);
          std::__cxx11::string::~string((string *)&local_358);
          bVar3 = false;
        }
        else {
LAB_0061ad40:
          cmAlphaNum::cmAlphaNum(&local_408,'\"');
          cmAlphaNum::cmAlphaNum(&local_438,(string *)local_328);
          local_439 = '\"';
          cmStrCat<char>(&local_3d8,&local_408,&local_438,&local_439);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&configs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          bVar3 = true;
        }
        std::__cxx11::string::~string((string *)local_328);
        if (bVar3) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      bVar2 = false;
    }
    else {
      this_01 = cmLocalGenerator::GetMakefile(this->LG);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c0);
      poVar4 = std::operator<<((ostream *)local_2c0,"The \"");
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(gte);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" target\'s interface file set \"");
      psVar5 = cmFileSet::GetName_abi_cxx11_(fileSet);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4,"\" of type \"");
      poVar4 = std::operator<<(poVar4,(string *)this_00);
      std::operator<<(poVar4,
                      "\" contains context-sensitive base directory entries which is not supported."
                     );
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
    if (bVar2) goto LAB_0061aeb8;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_450," ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_460);
  cmJoin(__return_storage_ptr__,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,local_450,local_460);
LAB_0061aeb8:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportBuildFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    bool const contextSensitive =
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->LG->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base directory entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& directory : directories) {
      auto dest = cmOutputConverter::EscapeForCMake(
        directory, cmOutputConverter::WrapQuotes::NoWrap);

      if (contextSensitive && configs.size() != 1) {
        resultVector.push_back(
          cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
      } else {
        resultVector.push_back(cmStrCat('"', dest, '"'));
        break;
      }
    }
  }

  return cmJoin(resultVector, " ");
}